

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O3

newtRef NsSetContains(newtRefArg rcvr,newtRefArg array,newtRefArg item)

{
  _Bool _Var1;
  uint32_t uVar2;
  void *pvVar3;
  newtRef nVar4;
  ulong v;
  
  _Var1 = NewtRefIsArray(array);
  if (!_Var1) {
    nVar4 = NewtThrow(-0xbd11,array);
    return nVar4;
  }
  pvVar3 = NewtRefToData(array);
  uVar2 = NewtLength(array);
  if (uVar2 != 0) {
    v = 0;
    do {
      if (*(newtRefArg *)((long)pvVar3 + v * 8) == item) {
        nVar4 = NewtMakeInteger(v);
        return nVar4;
      }
      v = v + 1;
    } while (uVar2 != v);
  }
  return 2;
}

Assistant:

newtRef NsSetContains(newtRefArg rcvr, newtRefArg array, newtRefArg item) {
    if (!NewtRefIsArray(array)) {
        return NewtThrow(kNErrNotAnArray, array);
    }
    
    newtRef *	slots;
    uint32_t	n;
    uint32_t	i;
    
    slots = NewtRefToSlots(array);
    n = NewtLength(array);
    
    for (i = 0; i < n; i++)
    {
        if (slots[i] == item) {
            return NewtMakeInteger(i);
        }
    }
    
    return kNewtRefNIL;
}